

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  short *psVar1;
  ImGuiItemStatusFlags *pIVar2;
  int *piVar3;
  ImRect *pIVar4;
  ImVec2 IVar5;
  ImGuiNavLayer IVar6;
  ImGuiID IVar7;
  uint uVar8;
  int iVar9;
  ImGuiWindow *window_00;
  ImGuiWindow *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  uint uVar13;
  ImGuiID id_1;
  ImGuiNavItemData *pIVar14;
  ImGuiContext *g;
  ImGuiWindow *window;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pIVar11 = GImGui;
  window_00 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar5 = bb->Max;
  (pIVar11->LastItemData).Rect.Min = bb->Min;
  (pIVar11->LastItemData).Rect.Max = IVar5;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  IVar5 = nav_bb_arg->Max;
  (pIVar11->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar11->LastItemData).NavRect.Max = IVar5;
  uVar13 = extra_flags | pIVar11->CurrentItemFlags;
  (pIVar11->LastItemData).InFlags = uVar13;
  (pIVar11->LastItemData).StatusFlags = 0;
  if (id == 0) {
    (pIVar11->NextItemData).Flags = 0;
    bVar12 = IsClippedEx(bb,0);
    if (bVar12) {
      return false;
    }
    goto LAB_00139536;
  }
  if (pIVar11->ActiveId == id) {
    pIVar11->ActiveIdIsAlive = id;
  }
  if (pIVar11->ActiveIdPreviousFrame == id) {
    pIVar11->ActiveIdPreviousFrameIsAlive = true;
  }
  IVar6 = (window_00->DC).NavLayerCurrent;
  psVar1 = &(window_00->DC).NavLayersActiveMaskNext;
  *psVar1 = *psVar1 | (ushort)(1 << ((byte)IVar6 & 0x1f));
  IVar7 = pIVar11->NavId;
  if ((((IVar7 == id) || (pIVar11->NavAnyRequest == true)) &&
      (pIVar10 = pIVar11->NavWindow, pIVar10->RootWindowForNav == window_00->RootWindowForNav)) &&
     ((window_00 == pIVar10 || (((uint)(pIVar10->Flags | window_00->Flags) >> 0x17 & 1) != 0)))) {
    IVar5 = (pIVar11->LastItemData).NavRect.Min;
    fVar18 = IVar5.x;
    fVar19 = IVar5.y;
    IVar5 = (pIVar11->LastItemData).NavRect.Max;
    fVar20 = IVar5.x;
    fVar21 = IVar5.y;
    bVar12 = pIVar11->NavInitRequest;
    if ((bVar12 == true) && ((uVar13 & 4) == 0 && IVar6 == pIVar11->NavLayer)) {
      if ((uVar13 & 0x10) == 0) {
        pIVar11->NavInitResultId = id;
        IVar5 = (window_00->DC).CursorStartPos;
        fVar15 = IVar5.x;
        fVar16 = IVar5.y;
        (pIVar11->NavInitResultRectRel).Min.x = fVar18 - fVar15;
        (pIVar11->NavInitResultRectRel).Min.y = fVar19 - fVar16;
        (pIVar11->NavInitResultRectRel).Max.x = fVar20 - fVar15;
        (pIVar11->NavInitResultRectRel).Max.y = fVar21 - fVar16;
LAB_001395e8:
        pIVar11->NavInitRequest = false;
        pIVar11->NavAnyRequest = pIVar11->NavMoveScoringItems;
        bVar12 = false;
      }
      else if (pIVar11->NavInitResultId == 0) {
        pIVar11->NavInitResultId = id;
        IVar5 = (window_00->DC).CursorStartPos;
        fVar15 = IVar5.x;
        fVar16 = IVar5.y;
        (pIVar11->NavInitResultRectRel).Min.x = fVar18 - fVar15;
        (pIVar11->NavInitResultRectRel).Min.y = fVar19 - fVar16;
        (pIVar11->NavInitResultRectRel).Max.x = fVar20 - fVar15;
        (pIVar11->NavInitResultRectRel).Max.y = fVar21 - fVar16;
        if ((uVar13 & 0x10) == 0) goto LAB_001395e8;
      }
    }
    if (pIVar11->NavMoveScoringItems == true) {
      uVar8 = pIVar11->NavMoveFlags;
      if ((uVar8 >> 10 & 1) == 0) {
        if ((uVar13 & 0xc) == 0 && ((uVar8 & 0x10) != 0 || IVar7 != id)) {
          pIVar14 = &pIVar11->NavMoveResultOther;
          if (window_00 == pIVar10) {
            pIVar14 = &pIVar11->NavMoveResultLocal;
          }
          bVar12 = NavScoreItem(pIVar14);
          if (bVar12) {
            NavApplyItemToResult(pIVar14);
          }
          if ((((pIVar11->NavMoveFlags & 0x20) != 0) &&
              (fVar15 = (window_00->ClipRect).Max.y, fVar19 < fVar15)) &&
             ((fVar16 = (window_00->ClipRect).Min.y, fVar16 < fVar21 &&
              ((fVar18 < (window_00->ClipRect).Max.x &&
               ((window_00->ClipRect).Min.x <= fVar20 && fVar20 != (window_00->ClipRect).Min.x))))))
          {
            fVar17 = fVar15;
            if (fVar21 <= fVar15) {
              fVar17 = fVar21;
            }
            if (fVar19 <= fVar15) {
              fVar15 = fVar19;
            }
            if ((fVar21 - fVar19) * 0.7 <=
                (float)(-(uint)(fVar21 < fVar16) & (uint)fVar16 |
                       ~-(uint)(fVar21 < fVar16) & (uint)fVar17) -
                (float)(-(uint)(fVar19 < fVar16) & (uint)fVar16 |
                       ~-(uint)(fVar19 < fVar16) & (uint)fVar15)) {
              pIVar14 = &pIVar11->NavMoveResultLocalVisible;
              bVar12 = NavScoreItem(pIVar14);
              if (bVar12) goto LAB_0013985d;
            }
          }
        }
      }
      else if ((uVar13 & 0x105) == 0x100 || (uVar8 >> 9 & 1) != 0) {
        pIVar14 = &pIVar11->NavMoveResultLocal;
        iVar9 = pIVar11->NavTabbingDir;
        if (iVar9 == -1) {
          if (IVar7 == id) {
            if ((pIVar11->NavMoveResultLocal).ID != 0) {
              pIVar11->NavMoveScoringItems = false;
              pIVar11->NavAnyRequest = bVar12;
            }
          }
          else {
LAB_0013985d:
            NavApplyItemToResult(pIVar14);
          }
        }
        else if (iVar9 == 0) {
          if ((pIVar11->NavTabbingResultFirst).ID == 0) {
            pIVar14 = &pIVar11->NavTabbingResultFirst;
LAB_00139867:
            NavMoveRequestResolveWithLastItem(pIVar14);
          }
        }
        else if (iVar9 == 1) {
          if ((pIVar11->NavTabbingResultFirst).ID == 0) {
            NavApplyItemToResult(&pIVar11->NavTabbingResultFirst);
          }
          piVar3 = &pIVar11->NavTabbingCounter;
          *piVar3 = *piVar3 + -1;
          if (*piVar3 == 0) goto LAB_00139867;
          if (pIVar11->NavId == id) {
            pIVar11->NavTabbingCounter = 1;
          }
        }
      }
    }
    if (pIVar11->NavId == id) {
      if (pIVar11->NavWindow != window_00) {
        SetNavWindow(window_00);
      }
      IVar6 = (window_00->DC).NavLayerCurrent;
      pIVar11->NavLayer = IVar6;
      pIVar11->NavFocusScopeId = (window_00->DC).NavFocusScopeIdCurrent;
      pIVar11->NavIdIsAlive = true;
      IVar5 = (window_00->DC).CursorStartPos;
      fVar15 = IVar5.x;
      fVar16 = IVar5.y;
      pIVar4 = window_00->NavRectRel + IVar6;
      (pIVar4->Min).x = fVar18 - fVar15;
      (pIVar4->Min).y = fVar19 - fVar16;
      (pIVar4->Max).x = fVar20 - fVar15;
      (pIVar4->Max).y = fVar21 - fVar16;
    }
  }
  if (window_00->ID == id) {
    __assert_fail("id != window->ID && \"Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x209b,
                  "bool ImGui::ItemAdd(const ImRect &, ImGuiID, const ImRect *, ImGuiItemFlags)");
  }
  (pIVar11->NextItemData).Flags = 0;
  bVar12 = IsClippedEx(bb,id);
  if (bVar12) {
    return false;
  }
LAB_00139536:
  bVar12 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
  if (bVar12) {
    pIVar2 = &(pIVar11->LastItemData).StatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  }
  return true;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        KeepAliveID(id);

        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}